

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_hash.c
# Opt level: O1

lzma_ret lzma_index_hash_decode
                   (lzma_index_hash *index_hash,uint8_t *in,size_t *in_pos,size_t in_size)

{
  lzma_check_state *check;
  size_t *vli_pos;
  lzma_check_state *check_00;
  uint uVar1;
  size_t sVar2;
  lzma_vli lVar3;
  size_t sVar4;
  lzma_ret lVar5;
  anon_enum_32 aVar6;
  int iVar7;
  uint32_t uVar8;
  ulong uVar9;
  ulong uVar10;
  lzma_vli *plVar11;
  
  uVar10 = *in_pos;
  if (in_size <= uVar10) {
    return LZMA_BUF_ERROR;
  }
  uVar9 = *in_pos;
  lVar5 = LZMA_OK;
  if (uVar9 < in_size) {
    vli_pos = &index_hash->pos;
    lVar5 = LZMA_OK;
    do {
      switch(index_hash->sequence) {
      case SEQ_BLOCK:
        *in_pos = uVar9 + 1;
        aVar6 = SEQ_COUNT;
        if (in[uVar9] != '\0') {
          return LZMA_DATA_ERROR;
        }
        break;
      case SEQ_COUNT:
        lVar5 = lzma_vli_decode(&index_hash->remaining,vli_pos,in,in_pos,in_size);
        if (lVar5 != LZMA_STREAM_END) goto LAB_00420f63;
        if (index_hash->remaining != (index_hash->blocks).count) {
          return LZMA_DATA_ERROR;
        }
        *vli_pos = 0;
        aVar6 = (uint)(index_hash->remaining == 0) * 2 + SEQ_UNPADDED;
        lVar5 = LZMA_OK;
        break;
      case SEQ_UNPADDED:
      case SEQ_UNCOMPRESSED:
        plVar11 = &index_hash->uncompressed_size;
        if (index_hash->sequence == SEQ_UNPADDED) {
          plVar11 = &index_hash->unpadded_size;
        }
        lVar5 = lzma_vli_decode(plVar11,vli_pos,in,in_pos,in_size);
        if (lVar5 == LZMA_STREAM_END) {
          index_hash->pos = 0;
          if (index_hash->sequence == SEQ_UNPADDED) {
            aVar6 = SEQ_UNCOMPRESSED;
            if (index_hash->unpadded_size + 0x8000000000000003 < 0x8000000000000008) {
              lVar5 = LZMA_OK;
              iVar7 = 1;
            }
            else {
LAB_00420e3a:
              index_hash->sequence = aVar6;
              lVar5 = LZMA_OK;
              iVar7 = 4;
            }
          }
          else {
            hash_append(&index_hash->records,index_hash->unpadded_size,index_hash->uncompressed_size
                       );
            lVar5 = LZMA_OK;
            iVar7 = 1;
            if ((((index_hash->records).blocks_size <= (index_hash->blocks).blocks_size) &&
                ((index_hash->records).uncompressed_size <= (index_hash->blocks).uncompressed_size))
               && ((index_hash->records).index_list_size <= (index_hash->blocks).index_list_size)) {
              plVar11 = &index_hash->remaining;
              *plVar11 = *plVar11 - 1;
              aVar6 = (uint)(*plVar11 == 0) * 2 + SEQ_UNPADDED;
              goto LAB_00420e3a;
            }
          }
        }
        else {
          iVar7 = 5;
        }
        if (iVar7 == 4) goto LAB_00420e48;
        if (iVar7 != 5) {
          return LZMA_DATA_ERROR;
        }
        goto LAB_00420f63;
      case SEQ_PADDING_INIT:
        lVar3 = (index_hash->records).index_list_size;
        uVar8 = lzma_vli_size((index_hash->records).count);
        index_hash->pos = (ulong)(~(uVar8 + (int)lVar3) & 3);
        index_hash->sequence = SEQ_PADDING;
      case SEQ_PADDING:
        if (index_hash->pos == 0) {
          if ((index_hash->blocks).blocks_size != (index_hash->records).blocks_size) {
            return LZMA_DATA_ERROR;
          }
          if ((index_hash->blocks).uncompressed_size != (index_hash->records).uncompressed_size) {
            return LZMA_DATA_ERROR;
          }
          if ((index_hash->blocks).index_list_size != (index_hash->records).index_list_size) {
            return LZMA_DATA_ERROR;
          }
          check = &(index_hash->blocks).check;
          lzma_check_finish(check,LZMA_CHECK_SHA256);
          check_00 = &(index_hash->records).check;
          lzma_check_finish(check_00,LZMA_CHECK_SHA256);
          uVar8 = lzma_check_size(LZMA_CHECK_SHA256);
          iVar7 = bcmp(check,check_00,(ulong)uVar8);
          if (iVar7 != 0) {
            return LZMA_DATA_ERROR;
          }
          uVar8 = lzma_crc32(in + uVar10,*in_pos - uVar10,index_hash->crc32);
          index_hash->crc32 = uVar8;
          index_hash->sequence = SEQ_CRC32;
switchD_00420c97_caseD_6:
          while( true ) {
            sVar2 = *in_pos;
            if (sVar2 == in_size) {
              return LZMA_OK;
            }
            sVar4 = index_hash->pos;
            uVar1 = index_hash->crc32;
            *in_pos = sVar2 + 1;
            if (in[sVar2] != (uint8_t)(uVar1 >> ((byte)((int)sVar4 << 3) & 0x1f))) break;
            uVar10 = index_hash->pos + 1;
            index_hash->pos = uVar10;
            if (3 < uVar10) {
              return LZMA_STREAM_END;
            }
          }
          return LZMA_DATA_ERROR;
        }
        index_hash->pos = index_hash->pos - 1;
        sVar2 = *in_pos;
        *in_pos = sVar2 + 1;
        if (in[sVar2] != '\0') {
          return LZMA_DATA_ERROR;
        }
        goto LAB_00420e48;
      case SEQ_CRC32:
        goto switchD_00420c97_caseD_6;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/common/index_hash.c"
                      ,0x144,
                      "lzma_ret lzma_index_hash_decode(lzma_index_hash *, const uint8_t *, size_t *, size_t)"
                     );
      }
      index_hash->sequence = aVar6;
LAB_00420e48:
      uVar9 = *in_pos;
    } while (uVar9 < in_size);
  }
LAB_00420f63:
  uVar8 = lzma_crc32(in + uVar10,*in_pos - uVar10,index_hash->crc32);
  index_hash->crc32 = uVar8;
  return lVar5;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_index_hash_decode(lzma_index_hash *index_hash, const uint8_t *in,
		size_t *in_pos, size_t in_size)
{
	// Catch zero input buffer here, because in contrast to Index encoder
	// and decoder functions, applications call this function directly
	// instead of via lzma_code(), which does the buffer checking.
	if (*in_pos >= in_size)
		return LZMA_BUF_ERROR;

	// NOTE: This function has many similarities to index_encode() and
	// index_decode() functions found from index_encoder.c and
	// index_decoder.c. See the comments especially in index_encoder.c.
	const size_t in_start = *in_pos;
	lzma_ret ret = LZMA_OK;

	while (*in_pos < in_size)
	switch (index_hash->sequence) {
	case SEQ_BLOCK:
		// Check the Index Indicator is present.
		if (in[(*in_pos)++] != 0x00)
			return LZMA_DATA_ERROR;

		index_hash->sequence = SEQ_COUNT;
		break;

	case SEQ_COUNT: {
		ret = lzma_vli_decode(&index_hash->remaining,
				&index_hash->pos, in, in_pos, in_size);
		if (ret != LZMA_STREAM_END)
			goto out;

		// The count must match the count of the Blocks decoded.
		if (index_hash->remaining != index_hash->blocks.count)
			return LZMA_DATA_ERROR;

		ret = LZMA_OK;
		index_hash->pos = 0;

		// Handle the special case when there are no Blocks.
		index_hash->sequence = index_hash->remaining == 0
				? SEQ_PADDING_INIT : SEQ_UNPADDED;
		break;
	}

	case SEQ_UNPADDED:
	case SEQ_UNCOMPRESSED: {
		lzma_vli *size = index_hash->sequence == SEQ_UNPADDED
				? &index_hash->unpadded_size
				: &index_hash->uncompressed_size;

		ret = lzma_vli_decode(size, &index_hash->pos,
				in, in_pos, in_size);
		if (ret != LZMA_STREAM_END)
			goto out;

		ret = LZMA_OK;
		index_hash->pos = 0;

		if (index_hash->sequence == SEQ_UNPADDED) {
			if (index_hash->unpadded_size < UNPADDED_SIZE_MIN
					|| index_hash->unpadded_size
						> UNPADDED_SIZE_MAX)
				return LZMA_DATA_ERROR;

			index_hash->sequence = SEQ_UNCOMPRESSED;
		} else {
			// Update the hash.
			return_if_error(hash_append(&index_hash->records,
					index_hash->unpadded_size,
					index_hash->uncompressed_size));

			// Verify that we don't go over the known sizes. Note
			// that this validation is simpler than the one used
			// in lzma_index_hash_append(), because here we know
			// that values in index_hash->blocks are already
			// validated and we are fine as long as we don't
			// exceed them in index_hash->records.
			if (index_hash->blocks.blocks_size
					< index_hash->records.blocks_size
					|| index_hash->blocks.uncompressed_size
					< index_hash->records.uncompressed_size
					|| index_hash->blocks.index_list_size
					< index_hash->records.index_list_size)
				return LZMA_DATA_ERROR;

			// Check if this was the last Record.
			index_hash->sequence = --index_hash->remaining == 0
					? SEQ_PADDING_INIT : SEQ_UNPADDED;
		}

		break;
	}

	case SEQ_PADDING_INIT:
		index_hash->pos = (LZMA_VLI_C(4) - index_size_unpadded(
				index_hash->records.count,
				index_hash->records.index_list_size)) & 3;
		index_hash->sequence = SEQ_PADDING;

	// Fall through

	case SEQ_PADDING:
		if (index_hash->pos > 0) {
			--index_hash->pos;
			if (in[(*in_pos)++] != 0x00)
				return LZMA_DATA_ERROR;

			break;
		}

		// Compare the sizes.
		if (index_hash->blocks.blocks_size
				!= index_hash->records.blocks_size
				|| index_hash->blocks.uncompressed_size
				!= index_hash->records.uncompressed_size
				|| index_hash->blocks.index_list_size
				!= index_hash->records.index_list_size)
			return LZMA_DATA_ERROR;

		// Finish the hashes and compare them.
		lzma_check_finish(&index_hash->blocks.check, LZMA_CHECK_BEST);
		lzma_check_finish(&index_hash->records.check, LZMA_CHECK_BEST);
		if (memcmp(index_hash->blocks.check.buffer.u8,
				index_hash->records.check.buffer.u8,
				lzma_check_size(LZMA_CHECK_BEST)) != 0)
			return LZMA_DATA_ERROR;

		// Finish the CRC32 calculation.
		index_hash->crc32 = lzma_crc32(in + in_start,
				*in_pos - in_start, index_hash->crc32);

		index_hash->sequence = SEQ_CRC32;

	// Fall through

	case SEQ_CRC32:
		do {
			if (*in_pos == in_size)
				return LZMA_OK;

			if (((index_hash->crc32 >> (index_hash->pos * 8))
					& 0xFF) != in[(*in_pos)++])
				return LZMA_DATA_ERROR;

		} while (++index_hash->pos < 4);

		return LZMA_STREAM_END;

	default:
		assert(0);
		return LZMA_PROG_ERROR;
	}

out:
	// Update the CRC32,
	index_hash->crc32 = lzma_crc32(in + in_start,
			*in_pos - in_start, index_hash->crc32);

	return ret;
}